

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Writer.h
# Opt level: O0

HitWriter<Protein> * __thiscall
Alnout::Writer<Protein>::operator<<(Writer<Protein> *this,QueryHitsPair<Protein> *queryWithHits)

{
  ostream *this_00;
  initializer_list<unsigned_long> __l;
  bool bVar1;
  _Setiosflags _Var2;
  _Setw _Var3;
  _Setprecision _Var4;
  ostream *poVar5;
  reference pHVar6;
  size_t sVar7;
  unsigned_long *puVar8;
  reference pvVar9;
  unsigned_long uVar10;
  ulong uVar11;
  void *pvVar12;
  long lVar13;
  deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_> *this_01;
  Hit<Protein> *hit_00;
  Hit<Protein> *hit_01;
  float fVar14;
  float local_638;
  float local_630;
  float local_624;
  float local_61c;
  float gapsRatio;
  float identity;
  string local_478 [36];
  int local_454;
  undefined1 local_450 [8];
  string tstrand;
  string qstrand;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  unsigned_long local_390;
  undefined8 local_388;
  undefined8 local_380;
  undefined8 local_378;
  iterator local_370;
  undefined8 local_368;
  unsigned_long local_360;
  unsigned_long padLen;
  anon_struct_128_7_d437573b *line;
  iterator __end0_2;
  iterator __begin0_2;
  AlignmentLines *__range3;
  Sequence<Protein> local_2a8;
  undefined1 local_248 [8];
  AlignmentLines lines;
  size_t numGaps;
  size_t numMatches;
  size_t numCols;
  string local_1c0;
  int local_19c;
  string local_198 [32];
  string local_178;
  int local_154;
  unsigned_long local_150;
  unsigned_long local_148;
  unsigned_long local_140;
  unsigned_long maxLen;
  undefined1 local_128 [8];
  string targetLen;
  string queryLen;
  Hit<Protein> *hit_1;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_> *__range2_1;
  Hit<Protein> *hit;
  const_iterator __end0;
  const_iterator __begin0;
  deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_> *__range2;
  ostream *out;
  deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_> *hits;
  Sequence<Protein> *query;
  QueryHitsPair<Protein> *queryWithHits_local;
  Writer<Protein> *this_local;
  
  this_01 = &queryWithHits->second;
  this_00 = (this->super_HitWriter<Protein>).mOutput;
  _Var2 = std::setiosflags(_S_fixed);
  std::operator<<(this_00,_Var2);
  poVar5 = std::operator<<(this_00,"Query >");
  poVar5 = std::operator<<(poVar5,(string *)queryWithHits);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(this_00," %Id   TLen  Target");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>::begin
            ((const_iterator *)&__end0._M_node,this_01);
  std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>::end((const_iterator *)&hit,this_01);
  while (bVar1 = std::operator!=((_Self *)&__end0._M_node,(_Self *)&hit), bVar1) {
    pHVar6 = std::_Deque_iterator<Hit<Protein>,_const_Hit<Protein>_&,_const_Hit<Protein>_*>::
             operator*((_Deque_iterator<Hit<Protein>,_const_Hit<Protein>_&,_const_Hit<Protein>_*> *)
                       &__end0._M_node);
    _Var4 = std::setprecision(0);
    poVar5 = std::operator<<(this_00,_Var4);
    _Var3 = std::setw(3);
    poVar5 = std::operator<<(poVar5,_Var3);
    fVar14 = Cigar::Identity(&pHVar6->alignment);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(double)fVar14 * 100.0);
    poVar5 = std::operator<<(poVar5,'%');
    _Var3 = std::setw(7);
    poVar5 = std::operator<<(poVar5,_Var3);
    sVar7 = Sequence<Protein>::Length(&pHVar6->target);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar7);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = std::operator<<(poVar5,(string *)pHVar6);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::_Deque_iterator<Hit<Protein>,_const_Hit<Protein>_&,_const_Hit<Protein>_*>::operator++
              ((_Deque_iterator<Hit<Protein>,_const_Hit<Protein>_&,_const_Hit<Protein>_*> *)
               &__end0._M_node);
  }
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>::begin
            ((const_iterator *)&__end0_1._M_node,this_01);
  std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>::end((const_iterator *)&hit_1,this_01);
  while (bVar1 = std::operator!=((_Self *)&__end0_1._M_node,(_Self *)&hit_1), bVar1) {
    pHVar6 = std::_Deque_iterator<Hit<Protein>,_const_Hit<Protein>_&,_const_Hit<Protein>_*>::
             operator*((_Deque_iterator<Hit<Protein>,_const_Hit<Protein>_&,_const_Hit<Protein>_*> *)
                       &__end0_1._M_node);
    sVar7 = Sequence<Protein>::Length(&queryWithHits->first);
    std::__cxx11::to_string((string *)((long)&targetLen.field_2 + 8),sVar7);
    sVar7 = Sequence<Protein>::Length(&pHVar6->target);
    std::__cxx11::to_string((string *)local_128,sVar7);
    local_148 = std::__cxx11::string::size();
    local_150 = std::__cxx11::string::size();
    puVar8 = std::max<unsigned_long>(&local_148,&local_150);
    local_140 = *puVar8;
    poVar5 = std::operator<<(this_00," Query");
    local_154 = (int)std::setw((int)local_140 + 1);
    poVar5 = std::operator<<(poVar5,(_Setw)local_154);
    sVar7 = Sequence<Protein>::Length(&queryWithHits->first);
    std::__cxx11::to_string(&local_178,sVar7);
    poVar5 = std::operator<<(poVar5,(string *)&local_178);
    Unit_abi_cxx11_();
    poVar5 = std::operator<<(poVar5,local_198);
    poVar5 = std::operator<<(poVar5," >");
    poVar5 = std::operator<<(poVar5,(string *)queryWithHits);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_198);
    std::__cxx11::string::~string((string *)&local_178);
    poVar5 = std::operator<<(this_00,"Target");
    local_19c = (int)std::setw((int)local_140 + 1);
    poVar5 = std::operator<<(poVar5,(_Setw)local_19c);
    sVar7 = Sequence<Protein>::Length(&pHVar6->target);
    std::__cxx11::to_string(&local_1c0,sVar7);
    poVar5 = std::operator<<(poVar5,(string *)&local_1c0);
    Unit_abi_cxx11_();
    poVar5 = std::operator<<(poVar5,(string *)&numCols);
    poVar5 = std::operator<<(poVar5," >");
    poVar5 = std::operator<<(poVar5,(string *)pHVar6);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&numCols);
    std::__cxx11::string::~string((string *)&local_1c0);
    QueryForAlignment(&local_2a8,pHVar6,&queryWithHits->first);
    TargetForAlignment((Sequence<Protein> *)&__range3,pHVar6,&queryWithHits->first);
    ExtractAlignmentLines
              ((AlignmentLines *)local_248,&local_2a8,(Sequence<Protein> *)&__range3,
               &pHVar6->alignment,&numMatches,&numGaps,
               (size_t *)
               &lines.
                super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node);
    Sequence<Protein>::~Sequence((Sequence<Protein> *)&__range3);
    Sequence<Protein>::~Sequence(&local_2a8);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::
    deque<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
    ::begin((iterator *)&__end0_2._M_node,
            (deque<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
             *)local_248);
    std::
    deque<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
    ::end((iterator *)&line,
          (deque<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
           *)local_248);
    while (bVar1 = std::operator!=((_Self *)&__end0_2._M_node,(_Self *)&line), bVar1) {
      padLen = (unsigned_long)
               std::
               _Deque_iterator<Alnout::Writer<Protein>::AlignmentLine,_Alnout::Writer<Protein>::AlignmentLine_&,_Alnout::Writer<Protein>::AlignmentLine_*>
               ::operator*((_Deque_iterator<Alnout::Writer<Protein>::AlignmentLine,_Alnout::Writer<Protein>::AlignmentLine_&,_Alnout::Writer<Protein>::AlignmentLine_*>
                            *)&__end0_2._M_node);
      pvVar9 = std::
               deque<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
               ::back((deque<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                       *)local_248);
      std::__cxx11::to_string(&local_3b0,pvVar9->qs);
      local_390 = std::__cxx11::string::size();
      pvVar9 = std::
               deque<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
               ::back((deque<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                       *)local_248);
      std::__cxx11::to_string(&local_3d0,pvVar9->ts);
      local_388 = std::__cxx11::string::size();
      pvVar9 = std::
               deque<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
               ::back((deque<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                       *)local_248);
      std::__cxx11::to_string(&local_3f0,pvVar9->qe);
      local_380 = std::__cxx11::string::size();
      pvVar9 = std::
               deque<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
               ::back((deque<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                       *)local_248);
      std::__cxx11::to_string((string *)((long)&qstrand.field_2 + 8),pvVar9->te);
      local_378 = std::__cxx11::string::size();
      local_370 = &local_390;
      local_368 = 4;
      __l._M_len = 4;
      __l._M_array = local_370;
      uVar10 = std::max<unsigned_long>(__l);
      std::__cxx11::string::~string((string *)(qstrand.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_3b0);
      local_360 = uVar10;
      QueryStrand_abi_cxx11_
                ((string *)((long)&tstrand.field_2 + 8),(Writer<Protein> *)pHVar6,hit_00);
      TargetStrand_abi_cxx11_((string *)local_450,(Writer<Protein> *)pHVar6,hit_01);
      uVar11 = std::__cxx11::string::empty();
      if ((uVar11 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)(tstrand.field_2._M_local_buf + 8)," ");
      }
      uVar11 = std::__cxx11::string::empty();
      if ((uVar11 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)local_450," ");
      }
      poVar5 = std::operator<<(this_00,"Qry ");
      local_454 = (int)std::setw((int)local_360);
      poVar5 = std::operator<<(poVar5,(_Setw)local_454);
      sVar7 = QueryPos(*(size_t *)padLen,&queryWithHits->first,pHVar6);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar7);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = std::operator<<(poVar5,(string *)(tstrand.field_2._M_local_buf + 8));
      poVar5 = std::operator<<(poVar5,(string *)(padLen + 0x10));
      poVar5 = std::operator<<(poVar5," ");
      sVar7 = QueryPos(*(size_t *)(padLen + 8),&queryWithHits->first,pHVar6);
      pvVar12 = (void *)std::ostream::operator<<(poVar5,sVar7);
      std::ostream::operator<<(pvVar12,std::endl<char,std::char_traits<char>>);
      uVar10 = local_360;
      lVar13 = std::__cxx11::string::size();
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_478,uVar10 + 5 + lVar13,' ',(allocator *)((long)&identity + 3));
      poVar5 = std::operator<<(this_00,local_478);
      poVar5 = std::operator<<(poVar5,(string *)(padLen + 0x60));
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_478);
      std::allocator<char>::~allocator((allocator<char> *)((long)&identity + 3));
      poVar5 = std::operator<<(this_00,"Tgt ");
      _Var3 = std::setw((int)local_360);
      poVar5 = std::operator<<(poVar5,_Var3);
      sVar7 = TargetPos(*(size_t *)(padLen + 0x30),&queryWithHits->first,pHVar6);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar7);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = std::operator<<(poVar5,(string *)local_450);
      poVar5 = std::operator<<(poVar5,(string *)(padLen + 0x40));
      poVar5 = std::operator<<(poVar5," ");
      sVar7 = TargetPos(*(size_t *)(padLen + 0x38),&queryWithHits->first,pHVar6);
      pvVar12 = (void *)std::ostream::operator<<(poVar5,sVar7);
      std::ostream::operator<<(pvVar12,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_450);
      std::__cxx11::string::~string((string *)(tstrand.field_2._M_local_buf + 8));
      std::
      _Deque_iterator<Alnout::Writer<Protein>::AlignmentLine,_Alnout::Writer<Protein>::AlignmentLine_&,_Alnout::Writer<Protein>::AlignmentLine_*>
      ::operator++((_Deque_iterator<Alnout::Writer<Protein>::AlignmentLine,_Alnout::Writer<Protein>::AlignmentLine_&,_Alnout::Writer<Protein>::AlignmentLine_*>
                    *)&__end0_2._M_node);
    }
    local_61c = (float)numGaps;
    local_624 = (float)numMatches;
    local_630 = (float)lines.
                       super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node;
    local_638 = (float)numMatches;
    poVar5 = (ostream *)std::ostream::operator<<(this_00,numMatches);
    poVar5 = std::operator<<(poVar5," cols, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,numGaps);
    poVar5 = std::operator<<(poVar5," ids (");
    _Var4 = std::setprecision(1);
    poVar5 = std::operator<<(poVar5,_Var4);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(local_61c / local_624) * 100.0);
    poVar5 = std::operator<<(poVar5,"%), ");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,(ulong)lines.
                                      super__Deque_base<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node);
    poVar5 = std::operator<<(poVar5," gaps (");
    _Var4 = std::setprecision(1);
    poVar5 = std::operator<<(poVar5,_Var4);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(local_630 / local_638) * 100.0);
    poVar5 = std::operator<<(poVar5,"%)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::
    deque<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
    ::~deque((deque<Alnout::Writer<Protein>::AlignmentLine,_std::allocator<Alnout::Writer<Protein>::AlignmentLine>_>
              *)local_248);
    std::__cxx11::string::~string((string *)local_128);
    std::__cxx11::string::~string((string *)(targetLen.field_2._M_local_buf + 8));
    std::_Deque_iterator<Hit<Protein>,_const_Hit<Protein>_&,_const_Hit<Protein>_*>::operator++
              ((_Deque_iterator<Hit<Protein>,_const_Hit<Protein>_&,_const_Hit<Protein>_*> *)
               &__end0_1._M_node);
  }
  return &this->super_HitWriter<Protein>;
}

Assistant:

HitWriter< Alphabet >&
  operator<<( const QueryHitsPair< Alphabet >& queryWithHits ) {
    const auto& query = queryWithHits.first;
    const auto& hits  = queryWithHits.second;

    auto& out = this->mOutput;

    // Output with fixed precision (sticky)
    out << std::setiosflags( std::ios::fixed );

    out << "Query >" << query.identifier << std::endl;
    out << " %Id   TLen  Target" << std::endl;
    for( auto& hit : hits ) {
      out << std::setprecision( 0 ) << std::setw( 3 )
              << ( hit.alignment.Identity() * 100.0 ) << '%' << std::setw( 7 )
              << hit.target.Length() << "  " << hit.target.identifier
              << std::endl;
    }
    out << std::endl;

    for( const auto& hit : hits ) {
      auto queryLen  = std::to_string( query.Length() );
      auto targetLen = std::to_string( hit.target.Length() );
      auto maxLen    = std::max( queryLen.size(), targetLen.size() );

      out << " Query" << std::setw( maxLen + 1 )
              << std::to_string( query.Length() ) << Unit() << " >"
              << query.identifier << std::endl;
      out << "Target" << std::setw( maxLen + 1 )
              << std::to_string( hit.target.Length() ) << Unit() << " >"
              << hit.target.identifier << std::endl;

      size_t numCols, numMatches, numGaps;
      auto   lines = ExtractAlignmentLines(
        QueryForAlignment( hit, query ), TargetForAlignment( hit, query ), hit.alignment,
        &numCols, &numMatches, &numGaps );

      out << std::endl;
      for( auto& line : lines ) {
        auto padLen = std::max( { std::to_string( lines.back().qs ).size(),
                                  std::to_string( lines.back().ts ).size(),
                                  std::to_string( lines.back().qe ).size(),
                                  std::to_string( lines.back().te ).size() } );

        auto qstrand = QueryStrand( hit );
        auto tstrand = TargetStrand( hit );

        if( !qstrand.empty() )
          qstrand += " ";

        if( !tstrand.empty() )
          tstrand += " ";

        out << "Qry " << std::setw( padLen )
                << QueryPos( line.qs, query, hit )
                << " " << qstrand << line.q << " "
                << QueryPos( line.qe, query, hit ) << std::endl;

        out << std::string( 5 + padLen + qstrand.size(), ' ' ) << line.a
                << std::endl;

        out << "Tgt " << std::setw( padLen )
                << TargetPos( line.ts, query, hit )
                << " " << tstrand << line.t << " "
                << TargetPos( line.te, query, hit ) << std::endl;

        out << std::endl;
      }

      float identity  = float( numMatches ) / float( numCols );
      float gapsRatio = float( numGaps ) / float( numCols );
      out << numCols << " cols, " << numMatches << " ids ("
              << std::setprecision( 1 ) << ( 100.0f * identity ) << "%), "
              << numGaps << " gaps (" << std::setprecision( 1 )
              << ( 100.0f * gapsRatio ) << "%)" << std::endl;

      out << std::endl;
    }
    return *this;
  }